

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O1

ssize_t __thiscall
Lodtalk::MethodAssembler::Assembler::send
          (Assembler *this,int __fd,void *__buf,size_t __n,int __flags)

{
  Oop OVar1;
  InstructionNode *pIVar2;
  size_t sVar3;
  undefined4 in_register_00000034;
  anon_union_8_4_0eb573b0_for_Oop_0 newLiteral;
  SpecialMessageSelector selectorIndex;
  bool bVar4;
  InstructionNode *local_38;
  
  newLiteral.uintValue._4_4_ = in_register_00000034;
  newLiteral.intValue._0_4_ = __fd;
  bVar4 = false;
  selectorIndex = Add;
  do {
    OVar1 = VMContext::getSpecialMessageSelector(this->context,selectorIndex);
    if (OVar1.field_0 == (anon_union_8_4_0eb573b0_for_Oop_0)newLiteral.pointer) {
      pIVar2 = (InstructionNode *)operator_new(0x30);
      pIVar2->position = 0;
      pIVar2->_vptr_InstructionNode = (_func_int **)&PTR__InstructionNode_00164f00;
      *(SpecialMessageSelector *)&pIVar2[1]._vptr_InstructionNode = selectorIndex + 0x60;
      *(undefined1 *)((long)&pIVar2[1]._vptr_InstructionNode + 4) = 0;
      local_38 = addInstruction(this,pIVar2);
      break;
    }
    bVar4 = X < selectorIndex;
    selectorIndex = selectorIndex + Minus;
  } while (selectorIndex != BasicNew);
  if (!bVar4) {
    return (ssize_t)local_38;
  }
  pIVar2 = (InstructionNode *)operator_new(0x30);
  sVar3 = addLiteral(this,(Oop)newLiteral);
  pIVar2->position = 0;
  pIVar2->_vptr_InstructionNode = (_func_int **)&PTR__InstructionNode_00165480;
  *(int *)&pIVar2[1]._vptr_InstructionNode = (int)sVar3;
  *(int *)((long)&pIVar2[1]._vptr_InstructionNode + 4) = (int)__buf;
  pIVar2 = addInstruction(this,pIVar2);
  return (ssize_t)pIVar2;
}

Assistant:

InstructionNode *Assembler::send(Oop selector, int argumentCount)
{
    for(int i = 0; i < (int)SpecialMessageSelector::SpecialMessageOptimizedCount; ++i)
    {
        auto specialSelector = context->getSpecialMessageSelector(SpecialMessageSelector(i));
        if(selector == specialSelector)
            return addInstruction(new SingleBytecodeInstruction(BytecodeSet::SpecialMessageAdd + i, false));
    }
	return addInstruction(new SendMessage((int)addLiteral(selector), argumentCount));
}